

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::TemplateNode> minja::Parser::parse(string *template_str,Options *options)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<minja::TemplateNode> sVar1;
  TemplateTokenIterator end;
  TemplateTokenIterator it;
  TemplateTokenIterator begin;
  TemplateTokenVector tokens;
  Parser parser;
  undefined1 in_stack_000004ff;
  TemplateTokenIterator *in_stack_00000500;
  TemplateTokenIterator *in_stack_00000508;
  TemplateTokenIterator *in_stack_00000510;
  Parser *in_stack_00000518;
  Parser *in_stack_00000838;
  string *in_stack_ffffffffffffff08;
  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  *this;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  *this_00;
  element_type *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  Options *in_stack_ffffffffffffff40;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff48;
  Parser *in_stack_ffffffffffffff50;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_a8;
  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  local_a0;
  string local_78 [120];
  
  this_01 = in_RDI;
  normalize_newlines(in_stack_ffffffffffffff08);
  std::make_shared<std::__cxx11::string,std::__cxx11::string>(in_stack_ffffffffffffff38);
  Parser(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2de826);
  std::__cxx11::string::~string(local_78);
  tokenize(in_stack_00000838);
  this = &local_a0;
  std::
  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  ::begin(this);
  this_00 = &local_a8;
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>
  ::
  __normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>*>
            (this_00,(__normal_iterator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                      *)this);
  std::
  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  ::end(this);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>
  ::
  __normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>*>
            (this_00,(__normal_iterator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                      *)this);
  parseTemplate(in_stack_00000518,in_stack_00000510,in_stack_00000508,in_stack_00000500,
                (bool)in_stack_000004ff);
  std::
  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  ::~vector((vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
             *)this_01);
  ~Parser((Parser *)0x2de8da);
  sVar1.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<minja::TemplateNode>)
         sVar1.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<TemplateNode> parse(const std::string& template_str, const Options & options) {
        Parser parser(std::make_shared<std::string>(normalize_newlines(template_str)), options);
        auto tokens = parser.tokenize();
        TemplateTokenIterator begin = tokens.begin();
        auto it = begin;
        TemplateTokenIterator end = tokens.end();
        return parser.parseTemplate(begin, it, end, /* fully= */ true);
    }